

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckOfCards.cpp
# Opt level: O0

void __thiscall DeckOfCards::currentState(DeckOfCards *this)

{
  vector<Cards,_std::allocator<Cards>_> *this_00;
  bool bVar1;
  reference pCVar2;
  ostream *this_01;
  undefined1 local_98 [8];
  Cards i;
  iterator __end1;
  iterator __begin1;
  vector<Cards,_std::allocator<Cards>_> *__range1;
  DeckOfCards *this_local;
  
  this_00 = this->deck;
  __end1 = std::vector<Cards,_std::allocator<Cards>_>::begin(this_00);
  i.it._M_current = (int *)std::vector<Cards,_std::allocator<Cards>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>
                                *)&i.it);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::__normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>::
             operator*(&__end1);
    Cards::Cards((Cards *)local_98,pCVar2);
    this_01 = ::operator<<((ostream *)&std::cout,(Cards *)local_98);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    Cards::~Cards((Cards *)local_98);
    __gnu_cxx::__normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void DeckOfCards::currentState() {
    for (Cards i : *deck) {
        cout << i << endl;
    }
}